

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_wav__on_seek_memory(void *pUserData,int offset,ma_dr_wav_seek_origin origin)

{
  if (origin == ma_dr_wav_seek_origin_current) {
    if (offset < 1) {
      if (*(ulong *)((long)pUserData + 0xd0) < (ulong)(uint)-offset) {
        return 0;
      }
    }
    else if (*(ulong *)((long)pUserData + 200) <
             *(ulong *)((long)pUserData + 0xd0) + (ulong)(uint)offset) {
      return 0;
    }
    *(long *)((long)pUserData + 0xd0) = *(long *)((long)pUserData + 0xd0) + (long)offset;
  }
  else {
    if (*(ulong *)((long)pUserData + 200) < (ulong)(uint)offset) {
      return 0;
    }
    *(long *)((long)pUserData + 0xd0) = (long)offset;
  }
  return 1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__on_seek_memory(void* pUserData, int offset, ma_dr_wav_seek_origin origin)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    MA_DR_WAV_ASSERT(pWav != NULL);
    if (origin == ma_dr_wav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStream.currentReadPos + offset > pWav->memoryStream.dataSize) {
                return MA_FALSE;
            }
        } else {
            if (pWav->memoryStream.currentReadPos < (size_t)-offset) {
                return MA_FALSE;
            }
        }
        pWav->memoryStream.currentReadPos += offset;
    } else {
        if ((ma_uint32)offset <= pWav->memoryStream.dataSize) {
            pWav->memoryStream.currentReadPos = offset;
        } else {
            return MA_FALSE;
        }
    }
    return MA_TRUE;
}